

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

bool __thiscall
CommandLineArguments::addGroupDotNameFilter(CommandLineArguments *this,int ac,char **av,int *i)

{
  size_t sVar1;
  TestFilter *pTVar2;
  SimpleString *pSVar3;
  SimpleString *this_00;
  int ac_00;
  SimpleStringCollection collection;
  SimpleString groupDotName;
  SimpleString SStack_68;
  SimpleStringCollection local_58;
  
  ac_00 = 0x11cf34;
  SimpleString::SimpleString((SimpleString *)&local_58,"-t");
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffc8,ac_00,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)i);
  SimpleString::~SimpleString((SimpleString *)&local_58);
  SimpleStringCollection::SimpleStringCollection(&local_58);
  SimpleString::SimpleString(&SStack_68,".");
  SimpleString::split((SimpleString *)&stack0xffffffffffffffc8,&SStack_68,&local_58);
  SimpleString::~SimpleString(&SStack_68);
  sVar1 = SimpleStringCollection::size(&local_58);
  if (sVar1 == 2) {
    pTVar2 = (TestFilter *)
             operator_new(0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O1/_deps/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                          ,0x11e);
    pSVar3 = SimpleStringCollection::operator[](&local_58,0);
    this_00 = SimpleStringCollection::operator[](&local_58,0);
    SimpleString::size(this_00);
    SimpleString::subString(&SStack_68,(size_t)pSVar3,0);
    TestFilter::TestFilter(pTVar2,&SStack_68);
    pTVar2 = TestFilter::add(pTVar2,this->groupFilters_);
    this->groupFilters_ = pTVar2;
    SimpleString::~SimpleString(&SStack_68);
    pTVar2 = (TestFilter *)
             operator_new(0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O1/_deps/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                          ,0x11f);
    pSVar3 = SimpleStringCollection::operator[](&local_58,1);
    TestFilter::TestFilter(pTVar2,pSVar3);
    pTVar2 = TestFilter::add(pTVar2,this->nameFilters_);
    this->nameFilters_ = pTVar2;
  }
  SimpleStringCollection::~SimpleStringCollection(&local_58);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  return sVar1 == 2;
}

Assistant:

bool CommandLineArguments::addGroupDotNameFilter(int ac, const char *const *av, int& i)
{
    SimpleString groupDotName = getParameterField(ac, av, i, "-t");
    SimpleStringCollection collection;
    groupDotName.split(".", collection);

    if (collection.size() != 2) return false;

    groupFilters_ = (new TestFilter(collection[0].subString(0, collection[0].size()-1)))->add(groupFilters_);
    nameFilters_ = (new TestFilter(collection[1]))->add(nameFilters_);
    return true;
}